

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O0

Expression * __thiscall
slang::ast::AssignmentExpression::fromComponents
          (AssignmentExpression *this,Compilation *compilation,
          optional<slang::ast::BinaryOperator> op,bitmask<slang::ast::AssignFlags> flags,
          Expression *lhs,Expression *rhs,SourceLocation assignLoc,TimingControl *timingControl,
          SourceRange sourceRange,ASTContext *context)

{
  bool bVar1;
  Type *pTVar2;
  StreamingConcatenationExpression *lhs_00;
  BinaryExpression *this_00;
  BinaryOperator *pBVar3;
  Expression *pEVar4;
  Symbol *pSVar5;
  undefined4 in_register_0000000c;
  SourceRange SVar6;
  SourceLocation SVar7;
  Symbol *sym;
  LValueReferenceExpression *lvalRef;
  bitmask<slang::ast::AssignFlags> local_50;
  bool local_49;
  _Optional_payload_base<slang::ast::BinaryOperator> local_48;
  AssignmentExpression *result;
  Expression *rhs_local;
  Expression *lhs_local;
  Compilation *compilation_local;
  SourceLocation assignLoc_local;
  _Optional_payload_base<slang::ast::BinaryOperator> _Stack_18;
  bitmask<slang::ast::AssignFlags> flags_local;
  optional<slang::ast::BinaryOperator> op_local;
  
  rhs_local = (Expression *)CONCAT44(in_register_0000000c,flags.m_bits);
  SVar7 = (SourceLocation)&timingControl;
  assignLoc_local._4_4_ =
       op.super__Optional_base<slang::ast::BinaryOperator,_true,_true>._M_payload.
       super__Optional_payload_base<slang::ast::BinaryOperator>._M_payload;
  result = (AssignmentExpression *)lhs;
  lhs_local = &this->super_Expression;
  compilation_local = (Compilation *)rhs;
  _Stack_18 = (_Optional_payload_base<slang::ast::BinaryOperator>)compilation;
  bitmask<slang::ast::AssignFlags>::bitmask(&local_50,NonBlocking);
  local_49 = bitmask<slang::ast::AssignFlags>::has
                       ((bitmask<slang::ast::AssignFlags> *)&assignLoc_local.field_0x4,&local_50);
  pTVar2 = not_null<const_slang::ast::Type_*>::operator*(&rhs_local->type);
  local_48 = (_Optional_payload_base<slang::ast::BinaryOperator>)
             BumpAllocator::
             emplace<slang::ast::AssignmentExpression,std::optional<slang::ast::BinaryOperator>&,bool,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Expression&,slang::ast::TimingControl_const*&,slang::SourceRange&>
                       ((BumpAllocator *)this,
                        (optional<slang::ast::BinaryOperator> *)&stack0xffffffffffffffe8,&local_49,
                        pTVar2,rhs_local,&result->super_Expression,(TimingControl **)&assignLoc,
                        (SourceRange *)SVar7);
  bVar1 = Expression::bad(rhs_local);
  if ((bVar1) || (bVar1 = Expression::bad(&result->super_Expression), bVar1)) {
    op_local.super__Optional_base<slang::ast::BinaryOperator,_true,_true>._M_payload.
    super__Optional_payload_base<slang::ast::BinaryOperator> =
         (_Optional_base<slang::ast::BinaryOperator,_true,_true>)
         Expression::badExpr((Compilation *)lhs_local,(Expression *)local_48);
  }
  else if (rhs_local->kind == Streaming) {
    lhs_00 = Expression::as<slang::ast::StreamingConcatenationExpression>(rhs_local);
    bVar1 = Bitstream::canBeTarget
                      (lhs_00,&result->super_Expression,(SourceLocation)compilation_local,
                       (ASTContext *)sourceRange.endLoc);
    if (bVar1) {
      bVar1 = Expression::requireLValue
                        (rhs_local,(ASTContext *)sourceRange.endLoc,
                         (SourceLocation)compilation_local,
                         (bitmask<slang::ast::AssignFlags>)assignLoc_local._4_4_,(Expression *)0x0,
                         (EvalContext *)0x0);
      if (bVar1) {
        op_local.super__Optional_base<slang::ast::BinaryOperator,_true,_true>._M_payload.
        super__Optional_payload_base<slang::ast::BinaryOperator> =
             (_Optional_base<slang::ast::BinaryOperator,_true,_true>)
             (_Optional_base<slang::ast::BinaryOperator,_true,_true>)local_48;
      }
      else {
        op_local.super__Optional_base<slang::ast::BinaryOperator,_true,_true>._M_payload.
        super__Optional_payload_base<slang::ast::BinaryOperator> =
             (_Optional_base<slang::ast::BinaryOperator,_true,_true>)
             Expression::badExpr((Compilation *)lhs_local,(Expression *)local_48);
      }
    }
    else {
      op_local.super__Optional_base<slang::ast::BinaryOperator,_true,_true>._M_payload.
      super__Optional_payload_base<slang::ast::BinaryOperator> =
           (_Optional_base<slang::ast::BinaryOperator,_true,_true>)
           Expression::badExpr((Compilation *)lhs_local,(Expression *)local_48);
    }
  }
  else {
    bVar1 = std::optional::operator_cast_to_bool((optional *)&stack0xffffffffffffffe8);
    pEVar4 = lhs_local;
    if (bVar1) {
      pTVar2 = not_null<const_slang::ast::Type_*>::operator*(&rhs_local->type);
      this_00 = (BinaryExpression *)
                BumpAllocator::
                emplace<slang::ast::LValueReferenceExpression,slang::ast::Type_const&,slang::SourceRange&>
                          ((BumpAllocator *)pEVar4,pTVar2,&rhs_local->sourceRange);
      pEVar4 = *(Expression **)((long)local_48 + 0x48);
      pBVar3 = std::optional<slang::ast::BinaryOperator>::operator*
                         ((optional<slang::ast::BinaryOperator> *)&stack0xffffffffffffffe8);
      SVar6.endLoc = SVar7;
      SVar6.startLoc = sourceRange.endLoc;
      pEVar4 = BinaryExpression::fromComponents
                         (this_00,pEVar4,(Expression *)(ulong)*pBVar3,
                          (BinaryOperator)compilation_local,(SourceLocation)timingControl,SVar6,
                          (ASTContext *)sourceRange.startLoc);
      *(Expression **)((long)local_48 + 0x48) = pEVar4;
    }
    SVar7 = sourceRange.endLoc;
    pTVar2 = not_null<const_slang::ast::Type_*>::operator*(&rhs_local->type);
    pEVar4 = Expression::convertAssignment
                       ((ASTContext *)SVar7,pTVar2,*(Expression **)((long)local_48 + 0x48),
                        (SourceLocation)compilation_local,(Expression **)((long)local_48 + 0x40),
                        (bitmask<slang::ast::AssignFlags> *)&assignLoc_local.field_0x4);
    *(Expression **)((long)local_48 + 0x48) = pEVar4;
    bVar1 = Expression::bad(*(Expression **)((long)local_48 + 0x48));
    if (bVar1) {
      op_local.super__Optional_base<slang::ast::BinaryOperator,_true,_true>._M_payload.
      super__Optional_payload_base<slang::ast::BinaryOperator> =
           (_Optional_base<slang::ast::BinaryOperator,_true,_true>)
           Expression::badExpr((Compilation *)lhs_local,(Expression *)local_48);
    }
    else {
      bVar1 = Expression::requireLValue
                        (*(Expression **)((long)local_48 + 0x40),(ASTContext *)sourceRange.endLoc,
                         (SourceLocation)compilation_local,
                         (bitmask<slang::ast::AssignFlags>)assignLoc_local._4_4_,(Expression *)0x0,
                         (EvalContext *)0x0);
      if (bVar1) {
        if (assignLoc != (SourceLocation)0x0) {
          pSVar5 = Expression::getSymbolReference(rhs_local,true);
          SVar7 = sourceRange.endLoc;
          if ((pSVar5 == (Symbol *)0x0) || (pSVar5->kind != ClockVar)) {
            if (*(int *)assignLoc == 8) {
              if (*(long *)((long)assignLoc + 8) == 0) {
                assert::assertFailed
                          ("timingControl->syntax",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/AssignmentExpressions.cpp"
                           ,0x207,
                           "static Expression &slang::ast::AssignmentExpression::fromComponents(Compilation &, std::optional<BinaryOperator>, bitmask<AssignFlags>, Expression &, Expression &, SourceLocation, const TimingControl *, SourceRange, const ASTContext &)"
                          );
              }
              SVar6 = slang::syntax::SyntaxNode::sourceRange(*(SyntaxNode **)((long)assignLoc + 8));
              ASTContext::addDiag((ASTContext *)SVar7,(DiagCode)0x400007,SVar6);
            }
          }
          else if (*(int *)assignLoc != 8) {
            if (*(long *)((long)assignLoc + 8) == 0) {
              assert::assertFailed
                        ("timingControl->syntax",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/AssignmentExpressions.cpp"
                         ,0x202,
                         "static Expression &slang::ast::AssignmentExpression::fromComponents(Compilation &, std::optional<BinaryOperator>, bitmask<AssignFlags>, Expression &, Expression &, SourceLocation, const TimingControl *, SourceRange, const ASTContext &)"
                        );
            }
            SVar6 = slang::syntax::SyntaxNode::sourceRange(*(SyntaxNode **)((long)assignLoc + 8));
            ASTContext::addDiag((ASTContext *)SVar7,(DiagCode)0x370007,SVar6);
          }
        }
        op_local.super__Optional_base<slang::ast::BinaryOperator,_true,_true>._M_payload.
        super__Optional_payload_base<slang::ast::BinaryOperator> =
             (_Optional_base<slang::ast::BinaryOperator,_true,_true>)
             (_Optional_base<slang::ast::BinaryOperator,_true,_true>)local_48;
      }
      else {
        op_local.super__Optional_base<slang::ast::BinaryOperator,_true,_true>._M_payload.
        super__Optional_payload_base<slang::ast::BinaryOperator> =
             (_Optional_base<slang::ast::BinaryOperator,_true,_true>)
             Expression::badExpr((Compilation *)lhs_local,(Expression *)local_48);
      }
    }
  }
  return (Expression *)
         (_Optional_payload<slang::ast::BinaryOperator,_true,_true,_true>)
         op_local.super__Optional_base<slang::ast::BinaryOperator,_true,_true>._M_payload.
         super__Optional_payload_base<slang::ast::BinaryOperator>;
}

Assistant:

Expression& AssignmentExpression::fromComponents(
    Compilation& compilation, std::optional<BinaryOperator> op, bitmask<AssignFlags> flags,
    Expression& lhs, Expression& rhs, SourceLocation assignLoc, const TimingControl* timingControl,
    SourceRange sourceRange, const ASTContext& context) {

    auto result = compilation.emplace<AssignmentExpression>(op, flags.has(AssignFlags::NonBlocking),
                                                            *lhs.type, lhs, rhs, timingControl,
                                                            sourceRange);

    if (lhs.bad() || rhs.bad())
        return badExpr(compilation, result);

    if (lhs.kind == ExpressionKind::Streaming) {
        if (!Bitstream::canBeTarget(lhs.as<StreamingConcatenationExpression>(), rhs, assignLoc,
                                    context)) {
            return badExpr(compilation, result);
        }

        if (!lhs.requireLValue(context, assignLoc, flags))
            return badExpr(compilation, result);

        return *result;
    }

    // If this is a compound assignment operator create a binary expression that will
    // apply the operator for us on the right hand side.
    if (op) {
        auto lvalRef = compilation.emplace<LValueReferenceExpression>(*lhs.type, lhs.sourceRange);
        result->right_ = &BinaryExpression::fromComponents(*lvalRef, *result->right_, *op,
                                                           assignLoc, sourceRange, context);
    }

    result->right_ = &convertAssignment(context, *lhs.type, *result->right_, assignLoc,
                                        &result->left_, &flags);
    if (result->right_->bad())
        return badExpr(compilation, result);

    if (!result->left_->requireLValue(context, assignLoc, flags))
        return badExpr(compilation, result);

    if (timingControl) {
        // Cycle delays are only allowed on clock vars, and clock vars
        // cannot use any timing control other than cycle delays.
        if (auto sym = lhs.getSymbolReference(); sym && sym->kind == SymbolKind::ClockVar) {
            if (timingControl->kind != TimingControlKind::CycleDelay) {
                ASSERT(timingControl->syntax);
                context.addDiag(diag::ClockVarBadTiming, timingControl->syntax->sourceRange());
            }
        }
        else if (timingControl->kind == TimingControlKind::CycleDelay) {
            ASSERT(timingControl->syntax);
            context.addDiag(diag::CycleDelayNonClock, timingControl->syntax->sourceRange());
        }
    }

    return *result;
}